

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QVariantList * __thiscall QVariant::toList(QVariantList *__return_storage_ptr__,QVariant *this)

{
  qvariant_cast<QList<QVariant>>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

QVariantList QVariant::toList() const
{
    return qvariant_cast<QVariantList>(*this);
}